

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O2

size_t ucs2_bytelen(char *str,ssize_t max_sz)

{
  long lVar1;
  size_t sVar2;
  char *p;
  
  if (max_sz == 0 || str == (char *)0x0) {
    return 0;
  }
  if (max_sz != 1) {
    sVar2 = 0;
    while ((str[sVar2] != '\0' || (str[sVar2 + 1] != '\0'))) {
      lVar1 = sVar2 + 3;
      sVar2 = sVar2 + 2;
      if (max_sz <= lVar1 && -1 < max_sz) {
        return max_sz;
      }
    }
    return sVar2;
  }
  return 1;
}

Assistant:

size_t
ucs2_bytelen   (const char   *str,
                ssize_t       max_sz)
{
    char *p = (char *) str;

    if (str == NULL || max_sz == 0)
        return 0;

    if (max_sz == 1)
        return 1;

    while (*p || *(p+1))
    {
        p += 2;
        if (max_sz >= 0 && p - str + 1 >= max_sz)
            return max_sz;
    }
    return p - str;
}